

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

Union * __thiscall
kj::Arena::
allocate<capnp::compiler::NodeTranslator::StructLayout::Union,capnp::compiler::NodeTranslator::StructLayout::Group&>
          (Arena *this,Group *params)

{
  Union *ptr;
  
  ptr = (Union *)allocateBytes(this,0x58,8,true);
  ptr->parent = &params->super_StructOrGroup;
  ptr->groupCount = 0;
  (ptr->discriminantOffset).ptr.isSet = false;
  (ptr->dataLocations).builder.ptr = (DataLocation *)0x0;
  (ptr->dataLocations).builder.pos =
       (RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *)0x0;
  (ptr->dataLocations).builder.endPtr = (DataLocation *)0x0;
  (ptr->dataLocations).builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  (ptr->pointerLocations).builder.ptr = (uint *)0x0;
  (ptr->pointerLocations).builder.pos = (RemoveConst<unsigned_int> *)0x0;
  (ptr->pointerLocations).builder.endPtr = (uint *)0x0;
  (ptr->pointerLocations).builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  setDestructor(this,ptr,destroyObject<capnp::compiler::NodeTranslator::StructLayout::Union>);
  return ptr;
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !KJ_HAS_TRIVIAL_DESTRUCTOR(T)));
  if (!KJ_HAS_TRIVIAL_CONSTRUCTOR(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}